

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O1

int tr_tcp_open(void *tr_socket)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  tr_tcp_socket *tmp;
  undefined8 uVar7;
  char *frmt;
  undefined8 uVar8;
  long in_FS_OFFSET;
  int oldcancelstate;
  timeval timeout;
  addrinfo *bind_addrinfo;
  addrinfo *res;
  fd_set wfds;
  int local_10c;
  timeval local_108;
  addrinfo *local_f8;
  addrinfo *local_f0;
  addrinfo local_e8;
  fd_set local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*tr_socket != -1) {
    __assert_fail("tcp_socket->socket == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/transport/tcp/tcp_transport.c"
                  ,99,"int tr_tcp_open(void *)");
  }
  local_f0 = (addrinfo *)0x0;
  local_f8 = (addrinfo *)0x0;
  local_e8.ai_addrlen = 0;
  local_e8._20_4_ = 0;
  local_e8.ai_addr = (sockaddr *)0x0;
  local_e8.ai_canonname = (char *)0x0;
  local_e8.ai_next = (addrinfo *)0x0;
  local_e8.ai_socktype = 1;
  local_e8.ai_protocol = 0;
  local_e8.ai_flags = 0x20;
  local_e8.ai_family = 0;
  if (*(code **)((long)tr_socket + 0x28) != (code *)0x0) {
    iVar2 = (**(code **)((long)tr_socket + 0x28))(*(undefined8 *)((long)tr_socket + 0x20));
    *(int *)tr_socket = iVar2;
    if (0 < iVar2) goto LAB_00108bca;
    uVar8 = *(undefined8 *)((long)tr_socket + 8);
    uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
    piVar4 = __errno_location();
    iVar2 = *piVar4;
LAB_00108c3c:
    pcVar5 = strerror(iVar2);
    frmt = "TCP Transport(%s:%s): Couldn\'t establish TCP connection, %s";
    goto LAB_00108c48;
  }
LAB_00108bca:
  if (*tr_socket < 0) {
    iVar2 = getaddrinfo(*(char **)((long)tr_socket + 8),*(char **)((long)tr_socket + 0x10),&local_e8
                        ,&local_f0);
    if (iVar2 != 0) {
      if (iVar2 == -0xb) {
        uVar8 = *(undefined8 *)((long)tr_socket + 8);
        uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
      }
      else {
        uVar8 = *(undefined8 *)((long)tr_socket + 8);
        uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
        pcVar5 = gai_strerror(iVar2);
      }
      lrtr_dbg("TCP Transport(%s:%s): getaddrinfo error, %s",uVar8,uVar7,pcVar5);
      iVar2 = -1;
      goto LAB_00108d25;
    }
    iVar2 = socket(local_f0->ai_family,local_f0->ai_socktype,local_f0->ai_protocol);
    *(int *)tr_socket = iVar2;
    if (iVar2 == -1) {
      uVar8 = *(undefined8 *)((long)tr_socket + 8);
      uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      frmt = "TCP Transport(%s:%s): Socket creation failed, %s";
LAB_00108c48:
      lrtr_dbg(frmt,uVar8,uVar7,pcVar5);
    }
    else {
      if (*(char **)((long)tr_socket + 0x18) != (char *)0x0) {
        iVar2 = getaddrinfo(*(char **)((long)tr_socket + 0x18),(char *)0x0,&local_e8,&local_f8);
        if (iVar2 == 0) {
          iVar2 = bind(*tr_socket,local_f8->ai_addr,local_f8->ai_addrlen);
          if (iVar2 == 0) {
            freeaddrinfo(local_f8);
            local_f8 = (addrinfo *)0x0;
            goto LAB_00108dd3;
          }
          uVar8 = *(undefined8 *)((long)tr_socket + 8);
          uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          frmt = "TCP Transport(%s:%s): Socket bind failed, %s";
        }
        else {
          if (iVar2 == -0xb) {
            uVar8 = *(undefined8 *)((long)tr_socket + 8);
            uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
          }
          else {
            uVar8 = *(undefined8 *)((long)tr_socket + 8);
            uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
            pcVar5 = gai_strerror(iVar2);
          }
          frmt = "TCP Transport(%s:%s): getaddrinfo error, %s";
        }
        goto LAB_00108c48;
      }
LAB_00108dd3:
      iVar2 = *tr_socket;
      uVar3 = fcntl(iVar2,3);
      if (uVar3 == 0xffffffff) {
LAB_00108f0f:
        uVar8 = *(undefined8 *)((long)tr_socket + 8);
        uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        frmt = "TCP Transport(%s:%s): Could not set socket to non blocking, %s";
        goto LAB_00108c48;
      }
      iVar2 = fcntl(iVar2,4,(ulong)(uVar3 | 0x800));
      if (iVar2 == -1) goto LAB_00108f0f;
      iVar2 = connect(*tr_socket,local_f0->ai_addr,local_f0->ai_addrlen);
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        if (iVar2 != 0x73) {
          uVar8 = *(undefined8 *)((long)tr_socket + 8);
          uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
          goto LAB_00108c3c;
        }
      }
      freeaddrinfo(local_f0);
      local_f0 = (addrinfo *)0x0;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      iVar2 = *tr_socket;
      iVar6 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar6 = iVar2;
      }
      local_b8.fds_bits[iVar6 >> 6] = local_b8.fds_bits[iVar6 >> 6] | 1L << ((byte)iVar2 & 0x3f);
      local_108.tv_sec = (__time_t)*(uint *)((long)tr_socket + 0x30);
      local_108.tv_usec = 0;
      pthread_setcancelstate(0,&local_10c);
      iVar2 = select(*tr_socket + 1,(fd_set *)0x0,&local_b8,(fd_set *)0x0,&local_108);
      pthread_setcancelstate(1,&local_10c);
      if (iVar2 < 0) {
        uVar8 = *(undefined8 *)((long)tr_socket + 8);
        uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        frmt = "TCP Transport(%s:%s): Could not select tcp socket, %s";
        goto LAB_00108c48;
      }
      if (iVar2 != 0) {
        iVar2 = get_socket_error(*tr_socket);
        if (iVar2 == -1) {
          uVar8 = *(undefined8 *)((long)tr_socket + 8);
          uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          frmt = "TCP Transport(%s:%s): Could not get socket error, %s";
        }
        else if (iVar2 < 1) {
          iVar2 = set_socket_blocking(*tr_socket);
          if (iVar2 != -1) goto LAB_00108bcf;
          uVar8 = *(undefined8 *)((long)tr_socket + 8);
          uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          frmt = "TCP Transport(%s:%s): Could not set socket to blocking, %s";
        }
        else {
          uVar8 = *(undefined8 *)((long)tr_socket + 8);
          uVar7 = *(undefined8 *)((long)tr_socket + 0x10);
          pcVar5 = strerror(iVar2);
          frmt = "TCP Transport(%s:%s): Could not establish TCP connection, %s";
        }
        goto LAB_00108c48;
      }
      lrtr_dbg("TCP Transport(%s:%s): Could not establish TCP connection in time",
               *(undefined8 *)((long)tr_socket + 8),*(undefined8 *)((long)tr_socket + 0x10));
    }
    iVar2 = -1;
    bVar1 = true;
  }
  else {
LAB_00108bcf:
    bVar1 = false;
    lrtr_dbg("TCP Transport(%s:%s): Connection established",*(undefined8 *)((long)tr_socket + 8),
             *(undefined8 *)((long)tr_socket + 0x10));
    iVar2 = 0;
  }
  if (local_f0 != (addrinfo *)0x0) {
    freeaddrinfo(local_f0);
  }
  if (local_f8 != (addrinfo *)0x0) {
    freeaddrinfo(local_f8);
  }
  if (bVar1) {
    tr_tcp_close(tr_socket);
  }
LAB_00108d25:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int tr_tcp_open(void *tr_socket)
{
	int rtval = TR_ERROR;
	int tcp_rtval = 0;
	struct tr_tcp_socket *tcp_socket = tr_socket;
	const struct tr_tcp_config *config = &tcp_socket->config;

	assert(tcp_socket->socket == -1);

	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct addrinfo *bind_addrinfo = NULL;

	bzero(&hints, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_ADDRCONFIG;

	if (config->new_socket) {
		tcp_socket->socket = (*config->new_socket)(config->data);
		if (tcp_socket->socket <= 0) {
			TCP_DBG("Couldn't establish TCP connection, %s", tcp_socket, strerror(errno));
			goto end;
		}
	}
	if (tcp_socket->socket < 0) {
		tcp_rtval = getaddrinfo(config->host, config->port, &hints, &res);
		if (tcp_rtval != 0) {
			if (tcp_rtval == EAI_SYSTEM) {
				TCP_DBG("getaddrinfo error, %s", tcp_socket, strerror(errno));
			} else {
				TCP_DBG("getaddrinfo error, %s", tcp_socket, gai_strerror(tcp_rtval));
			}
			return TR_ERROR;
		}

		tcp_socket->socket = socket(res->ai_family, res->ai_socktype, res->ai_protocol);
		if (tcp_socket->socket == -1) {
			TCP_DBG("Socket creation failed, %s", tcp_socket, strerror(errno));
			goto end;
		}

		if (tcp_socket->config.bindaddr) {
			tcp_rtval = getaddrinfo(tcp_socket->config.bindaddr, 0, &hints, &bind_addrinfo);
			if (tcp_rtval != 0) {
				if (tcp_rtval == EAI_SYSTEM) {
					TCP_DBG("getaddrinfo error, %s", tcp_socket, strerror(errno));
				} else {
					TCP_DBG("getaddrinfo error, %s", tcp_socket, gai_strerror(tcp_rtval));
				}
				goto end;
			}
			if (bind(tcp_socket->socket, bind_addrinfo->ai_addr, bind_addrinfo->ai_addrlen) != 0) {
				TCP_DBG("Socket bind failed, %s", tcp_socket, strerror(errno));
				goto end;
			}

			freeaddrinfo(bind_addrinfo);
			bind_addrinfo = NULL;
		}

		if (set_socket_non_blocking(tcp_socket->socket) == TR_ERROR) {
			TCP_DBG("Could not set socket to non blocking, %s", tcp_socket, strerror(errno));
			goto end;
		}

		if (connect(tcp_socket->socket, res->ai_addr, res->ai_addrlen) == -1 && errno != EINPROGRESS) {
			TCP_DBG("Couldn't establish TCP connection, %s", tcp_socket, strerror(errno));
			goto end;
		}

		freeaddrinfo(res);
		res = NULL;

		fd_set wfds;

		FD_ZERO(&wfds);
		FD_SET(tcp_socket->socket, &wfds);

		struct timeval timeout = {.tv_sec = tcp_socket->config.connect_timeout, .tv_usec = 0};
		int oldcancelstate;

		/* Enable cancellability for the select call
		 * to prevent rtr_stop from blocking for a long time.
		 * It must be the only blocking call in this function.
		 * Since local resources have all been freed this should be safe.
		 */
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
		int ret = select(tcp_socket->socket + 1, NULL, &wfds, NULL, &timeout);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);

		if (ret < 0) {
			TCP_DBG("Could not select tcp socket, %s", tcp_socket, strerror(errno));
			goto end;

		} else if (ret == 0) {
			TCP_DBG("Could not establish TCP connection in time", tcp_socket);
			goto end;
		}

		int socket_error = get_socket_error(tcp_socket->socket);

		if (socket_error == TR_ERROR) {
			TCP_DBG("Could not get socket error, %s", tcp_socket, strerror(errno));
			goto end;

		} else if (socket_error > 0) {
			TCP_DBG("Could not establish TCP connection, %s", tcp_socket, strerror(socket_error));
			goto end;
		}

		if (set_socket_blocking(tcp_socket->socket) == TR_ERROR) {
			TCP_DBG("Could not set socket to blocking, %s", tcp_socket, strerror(errno));
			goto end;
		}
	}

	TCP_DBG1("Connection established", tcp_socket);
	rtval = TR_SUCCESS;

end:
	if (res)
		freeaddrinfo(res);

	if (bind_addrinfo)
		freeaddrinfo(bind_addrinfo);
	if (rtval == -1)
		tr_tcp_close(tr_socket);
	return rtval;
}